

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PagePool.h
# Opt level: O0

PagePoolPage * __thiscall Memory::PagePool::GetPage(PagePool *this,bool useReservedPages)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  PagePoolPage *page_1;
  PagePoolPage *page;
  bool useReservedPages_local;
  PagePool *this_local;
  
  if (this->freePageList == (PagePoolFreePage *)0x0) {
    if ((useReservedPages) && (this->reservedPageList != (PagePoolFreePage *)0x0)) {
      this_local = (PagePool *)this->reservedPageList;
      this->reservedPageList = this->reservedPageList->nextFreePage;
      bVar2 = PagePoolPage::IsReserved((PagePoolPage *)this_local);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                           ,0x7a,"(page->IsReserved())","page->IsReserved()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
    }
    else {
      this_local = (PagePool *)PagePoolPage::New(&this->pageAllocator,false);
    }
  }
  else {
    this_local = (PagePool *)this->freePageList;
    this->freePageList = this->freePageList->nextFreePage;
    bVar2 = PagePoolPage::IsReserved((PagePoolPage *)this_local);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PagePool.h"
                         ,0x72,"(!page->IsReserved())","!page->IsReserved()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  return (PagePoolPage *)this_local;
}

Assistant:

PagePoolPage * GetPage(bool useReservedPages = false)
    {
        if (freePageList != nullptr)
        {
            PagePoolPage * page = freePageList;
            freePageList = freePageList->nextFreePage;
            Assert(!page->IsReserved());
            return page;
        }

        if (useReservedPages && reservedPageList != nullptr)
        {
            PagePoolPage * page = reservedPageList;
            reservedPageList = reservedPageList->nextFreePage;
            Assert(page->IsReserved());
            return page;
        }

        return PagePoolPage::New(&pageAllocator);
    }